

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

SymbolsWrapper * __thiscall
icu_63::number::impl::SymbolsWrapper::operator=(SymbolsWrapper *this,SymbolsWrapper *src)

{
  SymbolsPointerType SVar1;
  
  if (this != src) {
    doCleanup(this);
    SVar1 = src->fType;
    this->fType = SVar1;
    if (SVar1 - SYMPTR_DFS < 2) {
      this->fPtr = src->fPtr;
      (src->fPtr).dfs = (DecimalFormatSymbols *)0x0;
    }
  }
  return this;
}

Assistant:

SymbolsWrapper& SymbolsWrapper::operator=(SymbolsWrapper&& src) U_NOEXCEPT {
    if (this == &src) {
        return *this;
    }
    doCleanup();
    doMoveFrom(std::move(src));
    return *this;
}